

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O1

int nghttp2_session_change_extpri_stream_priority
              (nghttp2_session *session,int32_t stream_id,nghttp2_extpri *extpri_in,
              int ignore_client_signal)

{
  uint8_t u8extpri;
  int iVar1;
  nghttp2_stream *stream;
  nghttp2_extpri extpri;
  nghttp2_extpri local_28;
  
  local_28 = *extpri_in;
  if (session->server == '\0') {
    iVar1 = -0x207;
  }
  else {
    iVar1 = 0;
    if ((session->pending_no_rfc7540_priorities == '\x01') && (iVar1 = -0x1f5, stream_id != 0)) {
      stream = (nghttp2_stream *)nghttp2_map_find(&session->streams,stream_id);
      if (stream != (nghttp2_stream *)0x0) {
        if (7 < local_28.urgency) {
          local_28.urgency = 7;
        }
        if (ignore_client_signal != 0) {
          stream->flags = stream->flags | 0x20;
        }
        u8extpri = nghttp2_extpri_to_uint8(&local_28);
        iVar1 = session_update_stream_priority(session,stream,u8extpri);
      }
    }
  }
  return iVar1;
}

Assistant:

int nghttp2_session_change_extpri_stream_priority(
    nghttp2_session *session, int32_t stream_id,
    const nghttp2_extpri *extpri_in, int ignore_client_signal) {
  nghttp2_stream *stream;
  nghttp2_extpri extpri = *extpri_in;

  if (!session->server) {
    return NGHTTP2_ERR_INVALID_STATE;
  }

  if (session->pending_no_rfc7540_priorities != 1) {
    return 0;
  }

  if (stream_id == 0) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  stream = nghttp2_session_get_stream_raw(session, stream_id);
  if (!stream) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  if (extpri.urgency > NGHTTP2_EXTPRI_URGENCY_LOW) {
    extpri.urgency = NGHTTP2_EXTPRI_URGENCY_LOW;
  }

  if (ignore_client_signal) {
    stream->flags |= NGHTTP2_STREAM_FLAG_IGNORE_CLIENT_PRIORITIES;
  }

  return session_update_stream_priority(session, stream,
                                        nghttp2_extpri_to_uint8(&extpri));
}